

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_web(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int dam_type;
  int iVar2;
  CHAR_DATA *in_RCX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CHAR_DATA *in_stack_ffffffffffffff50;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6b;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  int in_stack_ffffffffffffff90;
  
  bVar1 = is_safe(in_stack_ffffffffffffff50,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (!bVar1) {
    bVar1 = saves_spell(in_stack_ffffffffffffff90,
                        (CHAR_DATA *)
                        CONCAT26(in_stack_ffffffffffffff8e,
                                 CONCAT24(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88))),
                        in_stack_ffffffffffffff84);
    if (!bVar1) {
      dam_type = number_range((int)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
      if (iVar2 <= dam_type) {
        act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
            (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
        act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
            (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
        act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
            (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
        in_RCX->move = in_RCX->move / 2;
        ch_00 = in_RCX;
        number_range((int)in_RCX,in_stack_ffffffffffffff4c);
        damage((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,dam_type,
               (bool)in_stack_ffffffffffffff6b);
        init_affect((AFFECT_DATA *)0x652076);
        number_range((int)ch_00,in_stack_ffffffffffffff4c);
        bVar1 = is_affected(in_RCX,in_EDI);
        if (bVar1) {
          return;
        }
        affect_to_char(ch_00,(AFFECT_DATA *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        return;
      }
    }
    act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
  }
  return;
}

Assistant:

void spell_web(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_safe(ch, victim))
		return;

	if (saves_spell(level + 5, victim, DAM_OTHER) || number_range(20, 35) < get_curr_stat(victim, STAT_DEX))
	{
		act("$n tries to entangle you in a sticky web, but you avoid it.", ch, 0, victim, TO_VICT);
		act("$n tries to entangle $N in a sticky web, but $E avoids it.", ch, 0, victim, TO_NOTVICT);
		act("You try to entangle $N, but $E avoids it.", ch, 0, victim, TO_CHAR);
		return;
	}

	act("$n releases a sticky web at you, impeding your mobility!", ch, 0, victim, TO_VICT);
	act("$n releases a sticky web at $N!", ch, 0, victim, TO_NOTVICT);
	act("You release a sticky web at $N!", ch, 0, victim, TO_CHAR);

	victim->move /= 2;

	damage(ch, victim, number_range(30, 50), sn, DAM_ACID, true);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = AFT_MALADY;
	af.level = level;
	af.location = APPLY_DEX;
	af.modifier = -(number_range(7, 15));
	af.duration = 3;

	if (!is_affected(victim, sn))
		affect_to_char(victim, &af);
}